

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxStateByIndex::Resolve(FxStateByIndex *this,FCompileContext *ctx)

{
  int iVar1;
  PClassActor *pPVar2;
  FxStateByIndex *pFVar3;
  
  pFVar3 = this;
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if (ctx->Class == (PStruct *)0x0) {
      pFVar3 = (FxStateByIndex *)0x0;
    }
    else {
      pPVar2 = dyn_cast<PClassActor>((DObject *)ctx->Class);
      if ((pPVar2 == (PClassActor *)0x0) || (pPVar2->NumOwnedStates < 1)) {
        __assert_fail("aclass != nullptr && aclass->NumOwnedStates > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x25f6,"virtual FxExpression *FxStateByIndex::Resolve(FCompileContext &)");
      }
      if (this->index < pPVar2->NumOwnedStates) {
        iVar1 = FStateLabelStorage::AddPointer(&StateLabels,pPVar2->OwnedStates + this->index);
        pFVar3 = (FxStateByIndex *)FMemArena::Alloc(&FxAlloc,0x38);
        (pFVar3->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
        FScriptPosition::FScriptPosition
                  (&(pFVar3->super_FxExpression).ScriptPosition,
                   &(this->super_FxExpression).ScriptPosition);
        (pFVar3->super_FxExpression).NeedResult = true;
        (pFVar3->super_FxExpression).ExprType = EFX_Constant;
        (pFVar3->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_0070d3e8;
        *(PInt **)&pFVar3->index = TypeSInt32;
        *(int *)&pFVar3[1].super_FxExpression._vptr_FxExpression = iVar1;
        (pFVar3->super_FxExpression).isresolved = true;
        (pFVar3->super_FxExpression).ValueType = (PType *)TypeStateLabel;
      }
      else {
        pFVar3 = (FxStateByIndex *)0x0;
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "%s: Attempt to jump to non existing state index %d",
                   FName::NameData.NameArray[(ctx->Class->super_PNamedType).TypeName.Index].Text);
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  }
  return &pFVar3->super_FxExpression;
}

Assistant:

FxExpression *FxStateByIndex::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	ABORT(ctx.Class);
	auto aclass = dyn_cast<PClassActor>(ctx.Class);

	// This expression type can only be used from actors, for everything else it has already produced a compile error.
	assert(aclass != nullptr && aclass->NumOwnedStates > 0);

	if (aclass->NumOwnedStates <= index)
	{
		ScriptPosition.Message(MSG_ERROR, "%s: Attempt to jump to non existing state index %d", 
			ctx.Class->TypeName.GetChars(), index);
		delete this;
		return nullptr;
	}
	int symlabel = StateLabels.AddPointer(aclass->OwnedStates + index);
	FxExpression *x = new FxConstant(symlabel, ScriptPosition);
	x->ValueType = TypeStateLabel;
	delete this;
	return x;
}